

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::HostImpl::OnInvokeMethod(HostImpl *this,ClientConnection *client,Frame *req_frame)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  DecoderFunc p_Var1;
  ClientID client_id_00;
  DeferredBase DVar2;
  uid_t uid;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  pid_t pid;
  uint64_t value;
  IPCFrame_InvokeMethodReply *this_01;
  pointer ppVar6;
  pointer pSVar7;
  undefined4 extraout_var;
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  *this_02;
  size_type sVar8;
  const_reference pvVar9;
  pointer pUVar10;
  type pCVar11;
  DeferredBase *this_03;
  InvokerFunc p_Var12;
  pointer pSVar13;
  ClientInfo local_1f0;
  DeferredBase local_1e0;
  ClientInfo local_1c0;
  undefined1 local_1b0 [8];
  ScopedClear scoped_key;
  undefined1 local_1a0 [4];
  uid_t peer_uid;
  undefined8 local_190;
  undefined8 local_188;
  function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> local_180;
  ClientID local_160;
  ClientID client_id;
  WeakPtr<perfetto::ipc::HostImpl> host_weak_ptr;
  undefined1 local_128 [8];
  Deferred<protozero::CppMessageObj> deferred_reply;
  unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
  decoded_req_args;
  Method *method;
  uint32_t method_id;
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  *methods;
  ServiceDescriptor *svc;
  Service *service;
  _Self local_d0;
  uint32_t local_c4;
  _Self local_c0;
  iterator svc_it;
  RequestID request_id;
  Frame reply_frame;
  InvokeMethod *req;
  Frame *req_frame_local;
  ClientConnection *client_local;
  HostImpl *this_local;
  
  reply_frame._has_field_.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)protos::gen::IPCFrame::msg_invoke_method(req_frame);
  protos::gen::IPCFrame::IPCFrame((IPCFrame *)&request_id);
  value = protos::gen::IPCFrame::request_id(req_frame);
  protos::gen::IPCFrame::set_request_id((IPCFrame *)&request_id,value);
  this_01 = protos::gen::IPCFrame::mutable_msg_invoke_method_reply((IPCFrame *)&request_id);
  protos::gen::IPCFrame_InvokeMethodReply::set_success(this_01,false);
  local_c4 = protos::gen::IPCFrame_InvokeMethod::service_id
                       ((IPCFrame_InvokeMethod *)
                        reply_frame._has_field_.super__Base_bitset<1UL>._M_w);
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_perfetto::ipc::HostImpl::ExposedService,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_perfetto::ipc::HostImpl::ExposedService>_>_>
       ::find(&this->services_,&local_c4);
  local_d0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_perfetto::ipc::HostImpl::ExposedService,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_perfetto::ipc::HostImpl::ExposedService>_>_>
       ::end(&this->services_);
  bVar3 = std::operator==(&local_c0,&local_d0);
  if (bVar3) {
    SendFrame(client,(Frame *)&request_id,-1);
  }
  else {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_perfetto::ipc::HostImpl::ExposedService>_>
             ::operator->(&local_c0);
    pSVar7 = std::unique_ptr<perfetto::ipc::Service,_std::default_delete<perfetto::ipc::Service>_>::
             get(&(ppVar6->second).instance);
    iVar4 = (*pSVar7->_vptr_Service[2])();
    this_02 = (vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               *)(CONCAT44(extraout_var,iVar4) + 8);
    uVar5 = protos::gen::IPCFrame_InvokeMethod::method_id
                      ((IPCFrame_InvokeMethod *)reply_frame._has_field_.super__Base_bitset<1UL>._M_w
                      );
    if (uVar5 != 0) {
      sVar8 = std::
              vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
              ::size(this_02);
      if (uVar5 <= sVar8) {
        pvVar9 = std::
                 vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
                 ::operator[](this_02,(ulong)(uVar5 - 1));
        p_Var1 = pvVar9->request_proto_decoder;
        protos::gen::IPCFrame_InvokeMethod::args_proto_abi_cxx11_
                  ((IPCFrame_InvokeMethod *)reply_frame._has_field_.super__Base_bitset<1UL>._M_w);
        (*p_Var1)((string *)&deferred_reply.super_DeferredBase.callback_._M_invoker);
        bVar3 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr *)&deferred_reply.super_DeferredBase.callback_._M_invoker);
        if (bVar3) {
          this_00 = &host_weak_ptr.handle_.
                     super___shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::function
                    ((function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)
                     this_00,(nullptr_t)0x0);
          Deferred<protozero::CppMessageObj>::Deferred
                    ((Deferred<protozero::CppMessageObj> *)local_128,
                     (function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)
                     this_00);
          std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::~function
                    ((function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)
                     &host_weak_ptr.handle_.
                      super___shared_ptr<perfetto::ipc::HostImpl_*,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          perfetto::base::WeakPtrFactory<perfetto::ipc::HostImpl>::GetWeakPtr
                    ((WeakPtrFactory<perfetto::ipc::HostImpl> *)&client_id);
          local_160 = client->id;
          bVar3 = protos::gen::IPCFrame_InvokeMethod::drop_reply
                            ((IPCFrame_InvokeMethod *)
                             reply_frame._has_field_.super__Base_bitset<1UL>._M_w);
          if (!bVar3) {
            perfetto::base::WeakPtr<perfetto::ipc::HostImpl>::WeakPtr
                      ((WeakPtr<perfetto::ipc::HostImpl> *)local_1a0,
                       (WeakPtr<perfetto::ipc::HostImpl> *)&client_id);
            local_190 = local_160;
            local_188 = value;
            ::std::function<void(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::
            function<perfetto::ipc::HostImpl::OnInvokeMethod(perfetto::ipc::HostImpl::ClientConnection*,perfetto::protos::gen::IPCFrame_const&)::__0,void>
                      ((function<void(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)
                       &local_180,(anon_class_32_3_c8c93cd2 *)local_1a0);
            Deferred<protozero::CppMessageObj>::Bind
                      ((Deferred<protozero::CppMessageObj> *)local_128,&local_180);
            std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::~function
                      (&local_180);
            OnInvokeMethod(perfetto::ipc::HostImpl::ClientConnection*,perfetto::protos::gen::IPCFrame_const&)
            ::$_0::~__0((__0 *)local_1a0);
          }
          pUVar10 = std::
                    unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                    ::get(&client->sock);
          scoped_key.key_._4_4_ = anon_unknown_0::GetPosixPeerUid(pUVar10);
          perfetto::base::CrashKey::SetScoped((CrashKey *)local_1b0,0x9f9f58);
          uid = scoped_key.key_._4_4_;
          client_id_00 = client->id;
          pUVar10 = std::
                    unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                    ::get(&client->sock);
          pid = anon_unknown_0::GetLinuxPeerPid(pUVar10);
          ClientInfo::ClientInfo(&local_1c0,client_id_00,uid,pid);
          (pSVar7->client_info_).client_id_ = local_1c0.client_id_;
          (pSVar7->client_info_).uid_ = local_1c0.uid_;
          (pSVar7->client_info_).pid_ = local_1c0.pid_;
          pSVar7->received_fd_ = &client->received_fd;
          p_Var12 = pvVar9->invoker;
          pSVar13 = pSVar7;
          pCVar11 = std::
                    unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
                    ::operator*((unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
                                 *)&deferred_reply.super_DeferredBase.callback_._M_invoker);
          this_03 = &local_1e0;
          DeferredBase::DeferredBase(this_03,(DeferredBase *)local_128);
          DVar2.callback_.super__Function_base._M_functor._8_8_ = p_Var12;
          DVar2.callback_.super__Function_base._M_functor._M_unused._M_object = this_03;
          DVar2.callback_.super__Function_base._M_manager = (_Manager_type)pSVar13;
          DVar2.callback_._M_invoker = (_Invoker_type)pCVar11;
          (*p_Var12)(pSVar13,pCVar11,DVar2);
          DeferredBase::~DeferredBase(&local_1e0);
          pSVar7->received_fd_ = (ScopedFile *)0x0;
          memset(&local_1f0,0,0x10);
          ClientInfo::ClientInfo(&local_1f0);
          (pSVar7->client_info_).client_id_ = local_1f0.client_id_;
          (pSVar7->client_info_).uid_ = local_1f0.uid_;
          (pSVar7->client_info_).pid_ = local_1f0.pid_;
          perfetto::base::CrashKey::ScopedClear::~ScopedClear((ScopedClear *)local_1b0);
          perfetto::base::WeakPtr<perfetto::ipc::HostImpl>::~WeakPtr
                    ((WeakPtr<perfetto::ipc::HostImpl> *)&client_id);
          Deferred<protozero::CppMessageObj>::~Deferred
                    ((Deferred<protozero::CppMessageObj> *)local_128);
        }
        else {
          SendFrame(client,(Frame *)&request_id,-1);
        }
        std::unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>::
        ~unique_ptr((unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
                     *)&deferred_reply.super_DeferredBase.callback_._M_invoker);
        goto LAB_006cd7b1;
      }
    }
    SendFrame(client,(Frame *)&request_id,-1);
  }
LAB_006cd7b1:
  protos::gen::IPCFrame::~IPCFrame((IPCFrame *)&request_id);
  return;
}

Assistant:

void HostImpl::OnInvokeMethod(ClientConnection* client,
                              const Frame& req_frame) {
  const Frame::InvokeMethod& req = req_frame.msg_invoke_method();
  Frame reply_frame;
  RequestID request_id = req_frame.request_id();
  reply_frame.set_request_id(request_id);
  reply_frame.mutable_msg_invoke_method_reply()->set_success(false);
  auto svc_it = services_.find(req.service_id());
  if (svc_it == services_.end())
    return SendFrame(client, reply_frame);  // |success| == false by default.

  Service* service = svc_it->second.instance.get();
  const ServiceDescriptor& svc = service->GetDescriptor();
  const auto& methods = svc.methods;
  const uint32_t method_id = req.method_id();
  if (method_id == 0 || method_id > methods.size())
    return SendFrame(client, reply_frame);

  const ServiceDescriptor::Method& method = methods[method_id - 1];
  std::unique_ptr<ProtoMessage> decoded_req_args(
      method.request_proto_decoder(req.args_proto()));
  if (!decoded_req_args)
    return SendFrame(client, reply_frame);

  Deferred<ProtoMessage> deferred_reply;
  base::WeakPtr<HostImpl> host_weak_ptr = weak_ptr_factory_.GetWeakPtr();
  ClientID client_id = client->id;

  if (!req.drop_reply()) {
    deferred_reply.Bind([host_weak_ptr, client_id,
                         request_id](AsyncResult<ProtoMessage> reply) {
      if (!host_weak_ptr)
        return;  // The reply came too late, the HostImpl has gone.
      host_weak_ptr->ReplyToMethodInvocation(client_id, request_id,
                                             std::move(reply));
    });
  }

  auto peer_uid = GetPosixPeerUid(client->sock.get());
  auto scoped_key = g_crash_key_uid.SetScoped(static_cast<int64_t>(peer_uid));
  service->client_info_ =
      ClientInfo(client->id, peer_uid, GetLinuxPeerPid(client->sock.get()));
  service->received_fd_ = &client->received_fd;
  method.invoker(service, *decoded_req_args, std::move(deferred_reply));
  service->received_fd_ = nullptr;
  service->client_info_ = ClientInfo();
}